

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O2

string * Boilerplate(string *__return_storage_ptr__,string *progname,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *filenames)

{
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"//\n",(allocator *)&local_b0);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  lVar2 = 0;
  for (uVar3 = 0;
      pbVar1 = (filenames->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(filenames->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar3 = uVar3 + 1) {
    std::operator+(&local_90,"//    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pbVar1->_M_dataplus)._M_p + lVar2));
    std::operator+(&local_b0,&local_90,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    lVar2 = lVar2 + 0x20;
  }
  std::operator+(&local_70,"// by ",progname);
  std::operator+(&local_50,&local_70,"\n");
  std::operator+(&local_90,&local_50,"// DO NOT MODIFY THIS FILE DIRECTLY\n");
  std::operator+(&local_b0,&local_90,"//\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

static string Boilerplate(const string& progname,
                          const vector<string>& filenames) {
  string out(string("//\n"));
  if (filenames.size() > 1)
    out.append("// This header file auto-generated for the templates\n");
  else
    out.append("// This header file auto-generated for the template\n");

  for (vector<string>::size_type i = 0; i < filenames.size(); ++i)
    out.append("//    " + filenames[i] + "\n");

  out.append("// by " + progname + "\n" +
             "// DO NOT MODIFY THIS FILE DIRECTLY\n" +
             "//\n");
  return out;
}